

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
          (ConfidentialTxInReference *this,ConfidentialTxIn *tx_in)

{
  ConfidentialTxIn *tx_in_local;
  ConfidentialTxInReference *this_local;
  
  AbstractTxInReference::AbstractTxInReference
            (&this->super_AbstractTxInReference,&tx_in->super_AbstractTxIn);
  (this->super_AbstractTxInReference)._vptr_AbstractTxInReference =
       (_func_int **)&PTR__ConfidentialTxInReference_00891ed8;
  ConfidentialTxIn::GetBlindingNonce(&this->blinding_nonce_,tx_in);
  ConfidentialTxIn::GetAssetEntropy(&this->asset_entropy_,tx_in);
  ConfidentialTxIn::GetIssuanceAmount(&this->issuance_amount_,tx_in);
  ConfidentialTxIn::GetInflationKeys(&this->inflation_keys_,tx_in);
  ConfidentialTxIn::GetIssuanceAmountRangeproof(&this->issuance_amount_rangeproof_,tx_in);
  ConfidentialTxIn::GetInflationKeysRangeproof(&this->inflation_keys_rangeproof_,tx_in);
  ConfidentialTxIn::GetPeginWitness(&this->pegin_witness_,tx_in);
  return;
}

Assistant:

ConfidentialTxInReference::ConfidentialTxInReference(
    const ConfidentialTxIn &tx_in)
    : AbstractTxInReference(tx_in),
      blinding_nonce_(tx_in.GetBlindingNonce()),
      asset_entropy_(tx_in.GetAssetEntropy()),
      issuance_amount_(tx_in.GetIssuanceAmount()),
      inflation_keys_(tx_in.GetInflationKeys()),
      issuance_amount_rangeproof_(tx_in.GetIssuanceAmountRangeproof()),
      inflation_keys_rangeproof_(tx_in.GetInflationKeysRangeproof()),
      pegin_witness_(tx_in.GetPeginWitness()) {
  // do nothing
}